

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char * sqlite3_vsnprintf(int n,char *zBuf,char *zFormat,__va_list_tag *ap)

{
  StrAccum local_30;
  
  if (0 < n) {
    local_30.db = (sqlite3 *)0x0;
    local_30.nChar = 0;
    local_30.mxAlloc = 0;
    local_30.tooBig = '\0';
    local_30.mallocFailed = '\0';
    local_30.useMalloc = '\0';
    local_30.zBase = zBuf;
    local_30.zText = zBuf;
    local_30.nAlloc = n;
    sqlite3VXPrintf(&local_30,0,zFormat,ap);
    zBuf = sqlite3StrAccumFinish(&local_30);
  }
  return zBuf;
}

Assistant:

SQLITE_API char *sqlite3_vsnprintf(int n, char *zBuf, const char *zFormat, va_list ap){
  StrAccum acc;
  if( n<=0 ) return zBuf;
  sqlite3StrAccumInit(&acc, zBuf, n, 0);
  acc.useMalloc = 0;
  sqlite3VXPrintf(&acc, 0, zFormat, ap);
  return sqlite3StrAccumFinish(&acc);
}